

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O2

void __thiscall
CP::queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::queue
          (queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new__(0x28);
  *puVar1 = 1;
  puVar1[1] = puVar1 + 3;
  puVar1[2] = 0;
  *(undefined1 *)(puVar1 + 3) = 0;
  this->mData = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar1 + 1);
  this->mCap = 1;
  this->mSize = 0;
  this->mFront = 0;
  return;
}

Assistant:

queue() {
      int cap = 1;
      mData = new T[cap]();
      mCap = cap;
      mSize = 0;
      mFront = 0;
    }